

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O2

uint Io_NtkWriteNodes(FILE *pFile,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  ProgressBar *p;
  char *pString;
  uint uVar3;
  int i_00;
  int i;
  int iVar4;
  uint uVar5;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    uVar3 = pNtk->vPos->nSize + pNtk->vPis->nSize;
    uVar5 = pNtk->nObjCounts[7] + uVar3 + pNtk->nObjCounts[8];
    printf("NumNodes : %d\t",(ulong)uVar5);
    printf("NumTerminals : %d\n",(ulong)uVar3);
    fwrite("UCLA    nodes    1.0\n",0x15,1,(FILE *)pFile);
    fprintf((FILE *)pFile,"NumNodes : %d\n",(ulong)uVar5);
    fprintf((FILE *)pFile,"NumTerminals : %d\n",(ulong)uVar3);
    for (iVar4 = 0; iVar4 < pNtk->vPis->nSize; iVar4 = iVar4 + 1) {
      pAVar1 = Abc_NtkPi(pNtk,iVar4);
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray]);
      fprintf((FILE *)pFile,"i%s_input\t",pcVar2);
      fwrite("terminal ",9,1,(FILE *)pFile);
      fprintf((FILE *)pFile," %d %d\n",1,1);
    }
    for (iVar4 = 0; iVar4 < pNtk->vPos->nSize; iVar4 = iVar4 + 1) {
      pAVar1 = Abc_NtkPo(pNtk,iVar4);
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
      fprintf((FILE *)pFile,"o%s_output\t",pcVar2);
      fwrite("terminal ",9,1,(FILE *)pFile);
      fprintf((FILE *)pFile," %d %d\n",1,1);
    }
    iVar4 = 0;
    uVar3 = 0;
    if (pNtk->nObjCounts[8] != 0) {
      uVar3 = 0;
      for (i_00 = 0; i_00 < pNtk->vBoxes->nSize; i_00 = i_00 + 1) {
        pAVar1 = Abc_NtkBox(pNtk,i_00);
        if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
          Io_NtkWriteLatchNode(pFile,pAVar1,0);
          uVar3 = uVar3 + 6;
        }
      }
    }
    p = Extra_ProgressBarStart(_stdout,pNtk->nObjCounts[7]);
    for (; iVar4 < pNtk->vObjs->nSize; iVar4 = iVar4 + 1) {
      pAVar1 = Abc_NtkObj(pNtk,iVar4);
      if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
        Extra_ProgressBarUpdate(p,iVar4,pString);
        uVar5 = Io_NtkWriteIntNode(pFile,pAVar1,0);
        uVar3 = uVar3 + uVar5;
      }
    }
    Extra_ProgressBarStop(p);
    return uVar3;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                ,0xbf,"unsigned int Io_NtkWriteNodes(FILE *, Abc_Ntk_t *)");
}

Assistant:

unsigned Io_NtkWriteNodes( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pLatch, * pNode;
    unsigned numTerms, numNodes, coreCellArea=0;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // write the forehead
    numTerms=Abc_NtkPiNum(pNtk)+Abc_NtkPoNum(pNtk);
    numNodes=numTerms+Abc_NtkNodeNum(pNtk)+Abc_NtkLatchNum(pNtk);
    printf("NumNodes : %d\t", numNodes );
    printf("NumTerminals : %d\n", numTerms );
    fprintf( pFile, "UCLA    nodes    1.0\n");
    fprintf( pFile, "NumNodes : %d\n", numNodes );
    fprintf( pFile, "NumTerminals : %d\n", numTerms );
    // write the PI/POs
    Io_NtkWritePiPoNodes( pFile, pNtk );
    // write the latches
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            Io_NtkWriteLatchNode( pFile, pLatch, NODES );
            coreCellArea+=6*coreHeight;
        }
    }
    // write each internal node
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        coreCellArea+=Io_NtkWriteIntNode( pFile, pNode, NODES );
    }
    Extra_ProgressBarStop( pProgress );
    return coreCellArea;
}